

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifcdr(bifcxdef *ctx,int argc)

{
  uint siz;
  ushort uVar1;
  runsdef *prVar2;
  runcxdef *prVar3;
  uint uVar4;
  uint16_t tmp;
  uint uVar5;
  runsdef stkval;
  runsdef val;
  runsdef local_40;
  runsdef local_30;
  
  prVar2 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar2 + -1;
  prVar3 = ctx->bifcxrun;
  if (prVar2[-1].runstyp == '\a') {
    local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)(prVar3->runcxsp->runsv).runsvstr;
    local_40.runstyp = '\a';
    uVar1 = *(ushort *)local_40.runsv.runsvstr;
    if (uVar1 - 2 == 0) {
      runpush(prVar3,5,&local_30);
    }
    else {
      uVar4 = datsiz((uint)*(byte *)(local_40.runsv.runsvnum + 2),
                     (void *)(local_40.runsv.runsvnum + 3));
      uVar5 = (uVar1 - 2) - (uVar4 + 1);
      siz = uVar5 + 2;
      prVar3 = ctx->bifcxrun;
      if ((uint)(*(int *)&prVar3->runcxhtop - *(int *)&prVar3->runcxhp) <= siz) {
        runhcmp(prVar3,siz,1,&local_40,(runsdef *)0x0,(runsdef *)0x0);
      }
      *(short *)ctx->bifcxrun->runcxhp = (short)siz;
      memcpy(ctx->bifcxrun->runcxhp + 2,local_40.runsv.runsvstr + (ulong)(uVar4 + 1) + 2,
             (ulong)uVar5);
      local_30.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
      local_30.runstyp = '\a';
      ctx->bifcxrun->runcxhp = local_30.runsv.runsvstr + siz;
      runrepush(ctx->bifcxrun,&local_30);
    }
    return;
  }
  prVar3->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3fc);
}

Assistant:

void bifcdr(bifcxdef *ctx, int argc)
{
    uchar   *lstp;
    uint     siz;
    uint     lstsiz;
    runsdef  val;
    runsdef  stkval;
    
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_LIST);
    
    lstp = runpoplst(ctx->bifcxrun);
    stkval.runstyp = DAT_LIST;
    stkval.runsv.runsvstr = lstp;
    
    /* get list's size, and point to its data string */
    lstsiz = osrp2(lstp) - 2;
    lstp += 2;
    
    if (lstsiz != 0)
    {
        /* deduct size of first element from size of list */
        siz = datsiz(*lstp, lstp+1) + 1;
        lstsiz -= siz;

        /* add in the size prefix for our new list size */
        lstsiz += 2;

        /* allocate space for new list containing rest of list */
        runhres1(ctx->bifcxrun, lstsiz, 1, &stkval);
        lstp = stkval.runsv.runsvstr + siz + 2;

        /* write out size followed by list value string */
        oswp2(ctx->bifcxrun->runcxhp, lstsiz);
        memcpy(ctx->bifcxrun->runcxhp+2, lstp, (size_t)(lstsiz-2));
        
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
        val.runstyp = DAT_LIST;
        ctx->bifcxrun->runcxhp += lstsiz;
        runrepush(ctx->bifcxrun, &val);
    }
    else
        runpush(ctx->bifcxrun, DAT_NIL, &val);   /* empty list - cdr is nil */
}